

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * fmt::v5::internal::
          parse_arg_id<wchar_t,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,fmt::v5::internal::error_handler>>>&,wchar_t>>
                    (wchar_t *begin,wchar_t *end,
                    precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>_&,_wchar_t>
                    *handler)

{
  long lVar1;
  wchar_t wVar2;
  specs_checker<fmt::v5::internal::dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>_>
  *psVar3;
  basic_parse_context<wchar_t,_fmt::v5::internal::error_handler> *pbVar4;
  dynamic_format_specs<wchar_t> *pdVar5;
  wchar_t *pwVar6;
  long lVar7;
  wchar_t *pwVar8;
  uint uVar9;
  
  wVar2 = *begin;
  if ((wVar2 == L'}') || (wVar2 == L':')) {
    psVar3 = handler->handler;
    pbVar4 = (psVar3->
             super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
             ).context_;
    uVar9 = pbVar4->next_arg_id_;
    if ((int)uVar9 < 0) {
      error_handler::on_error
                ((error_handler *)pbVar4,"cannot switch from manual to automatic argument indexing")
      ;
      uVar9 = 0;
    }
    else {
      pbVar4->next_arg_id_ = uVar9 + 1;
    }
    pdVar5 = (psVar3->
             super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
             ).specs_;
    (pdVar5->precision_ref).kind = INDEX;
    (pdVar5->precision_ref).field_1.index = uVar9;
  }
  else {
    if ((uint)(wVar2 + L'\xffffffd0') < 10) {
      if (wVar2 == L'0') {
        pwVar8 = begin + 1;
        uVar9 = 0;
      }
      else {
        pwVar6 = begin + 1;
        uVar9 = 0;
        do {
          if (0xccccccc < uVar9) {
            uVar9 = 0x80000000;
            pwVar8 = pwVar6 + -1;
            break;
          }
          uVar9 = (pwVar6[-1] + uVar9 * 10) - 0x30;
          pwVar8 = pwVar6;
          if (pwVar6 == end) break;
          begin = begin + 1;
          wVar2 = *pwVar6;
          pwVar6 = pwVar6 + 1;
          pwVar8 = begin;
        } while ((uint)(wVar2 + L'\xffffffd0') < 10);
        if ((int)uVar9 < 0) {
          error_handler::on_error
                    ((error_handler *)
                     (handler->handler->
                     super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                     ).context_,"number is too big");
        }
      }
      begin = pwVar8;
      if ((pwVar8 != end) && ((*pwVar8 == L':' || (*pwVar8 == L'}')))) {
        psVar3 = handler->handler;
        pbVar4 = (psVar3->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                 ).context_;
        if (pbVar4->next_arg_id_ < 1) {
          pbVar4->next_arg_id_ = -1;
        }
        else {
          error_handler::on_error
                    ((error_handler *)pbVar4,
                     "cannot switch from automatic to manual argument indexing");
        }
        pdVar5 = (psVar3->
                 super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
                 ).specs_;
        (pdVar5->precision_ref).kind = INDEX;
        (pdVar5->precision_ref).field_1.index = uVar9;
        return pwVar8;
      }
    }
    else if ((wVar2 == L'_') || ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a)) {
      lVar1 = 4;
      do {
        lVar7 = lVar1;
        pwVar6 = (wchar_t *)((long)begin + lVar7);
        if (pwVar6 == end) break;
        wVar2 = *pwVar6;
        lVar1 = lVar7 + 4;
      } while ((((uint)(wVar2 + L'\xffffffd0') < 10) || (wVar2 == L'_')) ||
              ((uint)((wVar2 & 0xffffffdfU) - 0x41U) < 0x1a));
      pdVar5 = (handler->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
               ).specs_;
      (pdVar5->precision_ref).kind = NAME;
      (pdVar5->precision_ref).field_1.name.value = begin;
      (pdVar5->precision_ref).field_1.name.size = lVar7 >> 2;
      return pwVar6;
    }
    error_handler::on_error
              ((error_handler *)
               (handler->handler->
               super_dynamic_specs_handler<fmt::v5::basic_parse_context<wchar_t,_fmt::v5::internal::error_handler>_>
               ).context_,"invalid format string");
  }
  return begin;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}